

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder> *this)

{
  bool bVar1;
  undefined1 condition;
  undefined1 uVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  element_type *peVar6;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters> *factory;
  ostream *poVar7;
  size_type sVar8;
  void *this_00;
  char *filename;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters> *ptVar9;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool in_stack_000000f7;
  CodeLocation *in_stack_000000f8;
  string *in_stack_00000100;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_suite_name;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
  generator;
  string *instantiation_name;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
  test_info;
  iterator test_it;
  bool generated_instantiations;
  CodeLocation *in_stack_fffffffffffffc88;
  CodeLocation *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
  *in_stack_fffffffffffffca0;
  value_type *in_stack_fffffffffffffca8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  pointer in_stack_fffffffffffffcc0;
  CodeLocation *in_stack_fffffffffffffcd8;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
  *in_stack_fffffffffffffcf8;
  int line_00;
  char *in_stack_fffffffffffffd00;
  Message *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  void *in_stack_fffffffffffffd68;
  CodeLocation *in_stack_fffffffffffffd70;
  ostream *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  ostream *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffd90;
  undefined6 in_stack_fffffffffffffda0;
  ParamNameGeneratorFunc *tear_down_tc;
  int32_t local_208;
  aom_color_primaries_t aStack_204;
  aom_transfer_characteristics_t aStack_200;
  aom_matrix_coefficients_t aStack_1fc;
  aom_color_range_t local_1f8;
  aom_chroma_sample_position_t aStack_1f4;
  int32_t iStack_1f0;
  int32_t iStack_1ec;
  CodecFactory *local_1e8;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
  *in_stack_fffffffffffffe38;
  string local_1b8 [32];
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  GTestLog local_168;
  GTestLog local_164;
  TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
  local_160;
  string local_130 [3];
  long local_c8;
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char *local_78;
  ParamNameGeneratorFunc *local_70;
  undefined1 local_58 [16];
  pointer local_48;
  InstantiationInfo *local_40;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
  local_38 [3];
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
  *local_20;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
        *)std::
          vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
          ::begin((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
                   *)in_stack_fffffffffffffc88);
  while( true ) {
    local_20 = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
                *)std::
                  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
                  ::end((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
                         *)in_stack_fffffffffffffc88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc90,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffc88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>_>
    ::operator*(&local_18);
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
    ::shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
                  *)in_stack_fffffffffffffc90,
                 (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
                  *)in_stack_fffffffffffffc88);
    local_38[0]._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffc88);
    while( true ) {
      local_40 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffc88);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc90,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffc88);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
                 ::operator->(local_38);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
               ::operator->(local_38);
      (*pIVar4->generator)(local_58);
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_70 = pIVar4->name_func;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_78 = pIVar4->file;
      pIVar4 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
               ::operator->(local_38);
      local_7c = pIVar4->line;
      std::__cxx11::string::string(local_a0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
        std::__cxx11::string::operator=(local_a0,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
      peVar6 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4cf7ce);
      std::__cxx11::string::operator+=(local_a0,(string *)peVar6);
      local_c8 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4cf7f9);
      ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
      ::begin((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
               *)in_stack_fffffffffffffc98);
      while( true ) {
        ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
        ::end((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
               *)in_stack_fffffffffffffc98);
        bVar1 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                ::operator!=((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                              *)in_stack_fffffffffffffc90,
                             (ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                              *)in_stack_fffffffffffffc88);
        ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
        ::~ParamIterator((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                          *)0x4cf854);
        iVar3 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        line_00 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        if (!bVar1) break;
        local_9 = 1;
        Message::Message((Message *)in_stack_fffffffffffffcc0);
        tear_down_tc = local_70;
        factory = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                  ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                               *)0x4cf8fd);
        TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
        ::TestParamInfo(in_stack_fffffffffffffca0,
                        (tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                         *)in_stack_fffffffffffffc98,(size_t)in_stack_fffffffffffffc90);
        (*tear_down_tc)(local_130,&local_160);
        condition = IsValidParamName(in_stack_fffffffffffffc98);
        uVar2 = IsTrue((bool)condition);
        if (!(bool)uVar2) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                             in_stack_fffffffffffffd00,line_00);
          poVar7 = GTestLog::GetStream(&local_164);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffd90 = std::operator<<(poVar7,"Parameterized test name \'");
          in_stack_fffffffffffffd88 = std::operator<<(in_stack_fffffffffffffd90,(string *)local_130)
          ;
          in_stack_fffffffffffffd80 =
               std::operator<<(in_stack_fffffffffffffd88,"\' is invalid, in ");
          in_stack_fffffffffffffd78 = std::operator<<(in_stack_fffffffffffffd80,local_78);
          in_stack_fffffffffffffd70 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffd78," line ");
          in_stack_fffffffffffffd68 =
               (void *)std::ostream::operator<<(in_stack_fffffffffffffd70,local_7c);
          std::ostream::operator<<(in_stack_fffffffffffffd68,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc90);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog((GTestLog *)
                             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                             (GTestLogSeverity)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                             in_stack_fffffffffffffd00,line_00);
          poVar7 = GTestLog::GetStream(&local_168);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_130);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_78);
          poVar7 = std::operator<<(poVar7," line ");
          this_00 = (void *)std::ostream::operator<<(poVar7,local_7c);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc90);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        local_178 = (_Base_ptr)pVar10.first._M_node;
        in_stack_fffffffffffffd17 = pVar10.second;
        local_170 = in_stack_fffffffffffffd17;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4cfce6);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4cfd03);
          in_stack_fffffffffffffd08 =
               Message::operator<<((Message *)in_stack_fffffffffffffc90,
                                   &in_stack_fffffffffffffc88->file);
          Message::operator<<((Message *)in_stack_fffffffffffffc90,
                              (char (*) [2])in_stack_fffffffffffffc88);
        }
        Message::operator<<((Message *)in_stack_fffffffffffffc90,&in_stack_fffffffffffffc88->file);
        in_stack_fffffffffffffd00 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffc98);
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffcf8 =
             ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
             ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                          *)0x4cfd98);
        PrintToString<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::EncodeParameters>>
                  (in_stack_fffffffffffffe38);
        std::__cxx11::string::c_str();
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4cfdd2);
        CodeLocation::CodeLocation(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        filename = (char *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffc88 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::
             GetSetUpCaseOrSuite(filename,iVar3);
        in_stack_fffffffffffffc90 =
             (CodeLocation *)
             SuiteApiResolver<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::
             GetTearDownCaseOrSuite(filename,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4cfe43);
        in_stack_fffffffffffffcc0 =
             std::
             unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_>_>
             ::operator->((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>_>_>
                           *)0x4cfe4f);
        ptVar9 = ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                 ::operator*((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                              *)0x4cfe61);
        local_1e8 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                    ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
        local_208 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                    ).super__Tuple_impl<1UL,_(anonymous_namespace)::EncodeParameters>.
                    super__Head_base<1UL,_(anonymous_namespace)::EncodeParameters,_false>.
                    _M_head_impl.lossless;
        aStack_204 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::EncodeParameters>.
                     super__Head_base<1UL,_(anonymous_namespace)::EncodeParameters,_false>.
                     _M_head_impl.color_primaries;
        aStack_200 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::EncodeParameters>.
                     super__Head_base<1UL,_(anonymous_namespace)::EncodeParameters,_false>.
                     _M_head_impl.transfer_characteristics;
        aStack_1fc = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::EncodeParameters>.
                     super__Head_base<1UL,_(anonymous_namespace)::EncodeParameters,_false>.
                     _M_head_impl.matrix_coefficients;
        local_1f8 = (ptVar9->
                    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                    ).super__Tuple_impl<1UL,_(anonymous_namespace)::EncodeParameters>.
                    super__Head_base<1UL,_(anonymous_namespace)::EncodeParameters,_false>.
                    _M_head_impl.color_range;
        aStack_1f4 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::EncodeParameters>.
                     super__Head_base<1UL,_(anonymous_namespace)::EncodeParameters,_false>.
                     _M_head_impl.chroma_sample_position;
        iStack_1f0 = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::EncodeParameters>.
                     super__Head_base<1UL,_(anonymous_namespace)::EncodeParameters,_false>.
                     _M_head_impl.render_size[0];
        iStack_1ec = (ptVar9->
                     super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>
                     ).super__Tuple_impl<1UL,_(anonymous_namespace)::EncodeParameters>.
                     super__Head_base<1UL,_(anonymous_namespace)::EncodeParameters,_false>.
                     _M_head_impl.render_size[1];
        iVar3 = (*in_stack_fffffffffffffcc0->_vptr_TestMetaFactoryBase[2])
                          (in_stack_fffffffffffffcc0,&local_208);
        in_stack_fffffffffffffc98 = (string *)CONCAT44(extraout_var,iVar3);
        in_stack_fffffffffffffcb8 = in_stack_fffffffffffffc98;
        in_stack_fffffffffffffcd8 = in_stack_fffffffffffffc88;
        MakeAndRegisterTestInfo
                  ((char *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                   (char *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                   in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                   (SetUpTestSuiteFunc)CONCAT17(condition,CONCAT16(uVar2,in_stack_fffffffffffffda0))
                   ,(TearDownTestSuiteFunc)tear_down_tc,(TestFactoryBase *)factory);
        CodeLocation::~CodeLocation((CodeLocation *)0x4cfefe);
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string((string *)local_130);
        Message::~Message((Message *)0x4cff32);
        ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
        ::operator++((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                      *)in_stack_fffffffffffffc90);
        local_c8 = local_c8 + 1;
      }
      ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
      ::~ParamIterator((ParamIterator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                        *)0x4cf86c);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4cfff7);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
      ::~ParamGenerator((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::EncodeParameters>_>
                         *)0x4d0011);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::InstantiationInfo>_>_>
      ::operator++(local_38);
    }
    std::
    shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
    ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>
                   *)0x4d0059);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  if ((local_9 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    CodeLocation::CodeLocation(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::
    vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
    ::empty((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AVxEncoderParmsGetToDecoder>::TestInfo>_>_>
             *)in_stack_fffffffffffffca0);
    InsertSyntheticTestCase(in_stack_00000100,in_stack_000000f8,in_stack_000000f7);
    CodeLocation::~CodeLocation((CodeLocation *)0x4d00f3);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }